

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Matchers::Impl::StdString::Equals::Equals(Equals *this,Equals *other)

{
  long in_RSI;
  undefined8 *in_RDI;
  MatcherImpl<Catch::Matchers::Impl::StdString::Equals,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffe0;
  
  MatcherImpl<Catch::Matchers::Impl::StdString::Equals,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::MatcherImpl(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__Equals_0021f0d0;
  std::__cxx11::string::string((string *)(in_RDI + 2),(string *)(in_RSI + 0x10));
  return;
}

Assistant:

Equals( Equals const& other ) : m_str( other.m_str ){}